

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O1

void __thiscall geometrycentral::surface::SurfaceMesh::compress(SurfaceMesh *this)

{
  _List_node_base *p_Var1;
  
  if (this->isCompressedFlag == false) {
    compressHalfedges(this);
    compressEdges(this);
    compressFaces(this);
    compressVertices(this);
    this->isCompressedFlag = true;
    for (p_Var1 = (this->compressCallbackList).
                  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        p_Var1 != (_List_node_base *)&this->compressCallbackList; p_Var1 = p_Var1->_M_next) {
      if (p_Var1[2]._M_next == (_List_node_base *)0x0) {
        ::std::__throw_bad_function_call();
      }
      (*(code *)p_Var1[2]._M_prev)(p_Var1 + 1);
    }
  }
  return;
}

Assistant:

void SurfaceMesh::compress() {
  if (isCompressed()) {
    return;
  }

  compressHalfedges();
  compressEdges();
  compressFaces();
  compressVertices();
  isCompressedFlag = true;

  for (auto& f : compressCallbackList) {
    f();
  }
}